

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

vec3 closest_point_point_triangle(vec3 p,vec3 a,vec3 b,vec3 c,triangle_contact_type_t *type)

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  int iVar2;
  float fVar3;
  float fVar5;
  undefined8 uVar4;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  vec3 vVar28;
  
  fVar23 = c.z;
  fVar16 = c.x;
  fVar17 = c.y;
  fVar15 = b.z;
  fVar10 = a.z;
  fVar18 = p.z;
  fVar27 = p.x;
  fVar19 = p.y;
  fVar13 = b.x;
  fVar14 = b.y;
  fVar8 = a.x;
  fVar11 = fVar13 - fVar8;
  fVar9 = a.y;
  fVar12 = fVar14 - fVar9;
  fVar20 = fVar15 - fVar10;
  fVar21 = fVar23 - fVar10;
  fVar3 = fVar16 - fVar8;
  fVar5 = fVar17 - fVar9;
  fVar6 = (fVar18 - fVar10) * fVar20 + (fVar27 - fVar8) * fVar11 + (fVar19 - fVar9) * fVar12;
  fVar7 = (fVar18 - fVar10) * fVar21 + (fVar27 - fVar8) * fVar3 + (fVar19 - fVar9) * fVar5;
  auVar1._4_4_ = -(uint)(fVar6 <= 0.0);
  auVar1._0_4_ = -(uint)(fVar6 <= 0.0);
  auVar1._8_4_ = -(uint)(fVar7 <= 0.0);
  auVar1._12_4_ = -(uint)(fVar7 <= 0.0);
  iVar2 = movmskpd(in_EAX,auVar1);
  if (iVar2 == 3) {
    *type = TRIANGLE_CONTACT_A;
    uVar4 = a._0_8_;
    fVar23 = fVar10;
  }
  else {
    uVar4 = c._0_8_;
    fVar24 = (fVar18 - fVar15) * fVar20 + (fVar27 - fVar13) * fVar11 + (fVar19 - fVar14) * fVar12;
    fVar25 = (fVar18 - fVar15) * fVar21 + (fVar27 - fVar13) * fVar3 + (fVar19 - fVar14) * fVar5;
    if ((fVar24 < 0.0) || (fVar24 < fVar25)) {
      fVar22 = fVar6 * fVar25 - fVar7 * fVar24;
      if ((-fVar24 < fVar24) || ((fVar6 < 0.0 || (0.0 < fVar22)))) {
        fVar26 = (fVar18 - fVar23) * fVar20 +
                 fVar11 * (fVar27 - fVar16) + fVar12 * (fVar19 - fVar17);
        fVar27 = (fVar18 - fVar23) * fVar21 + fVar3 * (fVar27 - fVar16) + fVar5 * (fVar19 - fVar17);
        if ((fVar27 < 0.0) || (fVar27 < fVar26)) {
          fVar19 = fVar26 * fVar7 - fVar27 * fVar6;
          if (((0.0 < fVar27) || (0.0 < fVar19)) || (fVar7 < 0.0)) {
            fVar18 = fVar24 * fVar27 - fVar25 * fVar26;
            if (((0.0 < fVar18) || (fVar25 = fVar25 - fVar24, fVar25 < 0.0)) ||
               (fVar26 - fVar27 < 0.0)) {
              *type = TRIANGLE_CONTACT_FACE;
              fVar27 = 1.0 / (fVar18 + fVar19 + fVar22);
              fVar19 = fVar19 * fVar27;
              fVar27 = fVar27 * fVar22;
              fVar23 = fVar21 * fVar27 + fVar20 * fVar19 + fVar10;
              uVar4 = CONCAT44(fVar5 * fVar27 + fVar12 * fVar19 + fVar9,
                               fVar3 * fVar27 + fVar11 * fVar19 + fVar8);
            }
            else {
              *type = TRIANGLE_CONTACT_BC;
              fVar25 = fVar25 / ((fVar26 - fVar27) + fVar25);
              fVar23 = (fVar23 - fVar15) * fVar25 + fVar15;
              uVar4 = CONCAT44(fVar25 * (fVar17 - fVar14) + fVar14,
                               fVar25 * (fVar16 - fVar13) + fVar13);
            }
          }
          else {
            *type = TRIANGLE_CONTACT_AC;
            fVar7 = fVar7 / (fVar7 - fVar27);
            uVar4 = CONCAT44(fVar5 * fVar7 + fVar9,fVar3 * fVar7 + fVar8);
            fVar23 = fVar10 + fVar21 * fVar7;
          }
        }
        else {
          *type = TRIANGLE_CONTACT_C;
        }
      }
      else {
        *type = TRIANGLE_CONTACT_AB;
        fVar6 = fVar6 / (fVar6 - fVar24);
        fVar23 = fVar10 + fVar20 * fVar6;
        uVar4 = CONCAT44(fVar12 * fVar6 + fVar9,fVar11 * fVar6 + fVar8);
      }
    }
    else {
      *type = TRIANGLE_CONTACT_B;
      uVar4 = b._0_8_;
      fVar23 = fVar15;
    }
  }
  vVar28.z = fVar23;
  vVar28.x = (float)(int)uVar4;
  vVar28.y = (float)(int)((ulong)uVar4 >> 0x20);
  return vVar28;
}

Assistant:

vec3 closest_point_point_triangle(vec3 p, vec3 a, vec3 b, vec3 c, triangle_contact_type_t *type) {
    vec3 ab = vec3_subtract(b, a);
    vec3 ac = vec3_subtract(c, a);
    vec3 ap = vec3_subtract(p, a);
    float d1 = vec3_dot(ab, ap);
    float d2 = vec3_dot(ac, ap);
    if (d1 <= 0.0f && d2 <= 0.0f) {
        *type = TRIANGLE_CONTACT_A;
        return a;
    }

    vec3 bp = vec3_subtract(p, b);
    float d3 = vec3_dot(ab, bp);
    float d4 = vec3_dot(ac, bp);
    if (d3 >= 0.0f && d4 <= d3) {
        *type = TRIANGLE_CONTACT_B;
        return b; 
    }

    float vc = d1*d4 - d3*d2;
    if (vc <= 0.0f && d1 >= 0.0f && d3 <= 0.0f) {
        *type = TRIANGLE_CONTACT_AB;
        float v = d1 / (d1 - d3);
        return vec3_add(a, vec3_scale(ab, v));
    }

    vec3 cp = vec3_subtract(p, c);
    float d5 = vec3_dot(ab, cp);
    float d6 = vec3_dot(ac, cp);
    if (d6 >= 0.0f && d5 <= d6) {
        *type = TRIANGLE_CONTACT_C;
        return c;
    }

    float vb = d5*d2 - d1*d6;
    if (vb <= 0.0f && d2 >= 0.0f && d6 <= 0.0f) {
        *type = TRIANGLE_CONTACT_AC;
        float w = d2 / (d2 - d6);
        return vec3_add(a, vec3_scale(ac, w));
    }

    float va = d3*d6 - d5*d4;
    if (va <= 0.0f && (d4 - d3) >= 0.0f && (d5 - d6) >= 0.0f) {
        *type = TRIANGLE_CONTACT_BC;
        float w = (d4 - d3) / ((d4 - d3) + (d5 - d6));
        return vec3_add(b, vec3_scale(vec3_subtract(c, b), w));
    }

    *type = TRIANGLE_CONTACT_FACE;
    float denom = 1.0f / (va + vb + vc);
    float v = vb * denom;
    float w = vc * denom;
    return vec3_add(vec3_add(a, vec3_scale(ab, v)), vec3_scale(ac, w));
}